

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

double __thiscall OpenMD::Polynomial<double>::evaluateDerivative(Polynomial<double> *this,double *x)

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  double dVar4;
  double local_30;
  
  p_Var3 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_30 = 0.0;
  for (; (_Rb_tree_header *)p_Var3 != &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    _Var2 = p_Var3[1]._M_color;
    p_Var1 = p_Var3[1]._M_parent;
    dVar4 = fastpow<double>(*x,_Var2 - _S_black);
    local_30 = local_30 + (double)(int)_Var2 * dVar4 * (double)p_Var1;
  }
  return local_30;
}

Assistant:

Real evaluateDerivative(const Real& x) {
      Real result = Real();
      ExponentType exponent;
      CoefficientType coefficient;

      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        exponent    = i->first;
        coefficient = i->second;
        result += fastpow(x, exponent - 1) * coefficient * exponent;
      }

      return result;
    }